

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildElementSlot
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 slotIndex,RegSlot value,
          RegSlot instance)

{
  code *pcVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  SymOpnd *this_00;
  SymOpnd *this_01;
  Instr *instr;
  IndirOpnd *src1Opnd;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  RegOpnd *dstOpnd;
  PropertyKind propertyKind;
  uint uVar9;
  Func *pFVar10;
  Types type;
  OpCode OVar11;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_02;
  IRType type_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  bVar2 = OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4c9,"(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004b8f61;
    *puVar5 = 0;
  }
  if (1 < (ushort)(newOpcode - LdArr_Func) && instance != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4cb,
                       "(instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc)"
                       ,
                       "instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc"
                      );
    if (!bVar2) goto LAB_004b8f61;
    *puVar5 = 0;
  }
  this_02 = local_32;
  ValueType::ValueType((ValueType *)&this_02->field_0);
  switch(newOpcode) {
  case LdSlotArr:
    RVar4 = GetRegSlotFromInt64Reg(this,value);
    propertyKind = PropertyKindSlots;
    goto LAB_004b8edb;
  case LdSlot:
    RVar4 = GetRegSlotFromInt64Reg(this,value);
    propertyKind = PropertyKindSlotArray;
LAB_004b8edb:
    src1Opnd = (IndirOpnd *)BuildFieldOpnd(this,1,slotIndex,propertyKind,TyVar,true);
    pRVar7 = BuildDstOpnd(this,RVar4,TyInt64);
    pFVar10 = this->m_func;
    OVar11 = LdSlot;
LAB_004b8efa:
    instr = IR::Instr::New(OVar11,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,pFVar10);
    goto LAB_004b8d80;
  case LdSlot_Db:
  case StSlot_Db:
    type = FLOAT64;
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    bVar2 = newOpcode == StSlot_Db;
    type_00 = TyFloat64;
    break;
  case LdSlot_Int:
  case StSlot_Int:
    type = INT32;
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    bVar2 = newOpcode == StSlot_Int;
    type_00 = TyInt32;
    break;
  case LdSlot_Long:
  case StSlot_Long:
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    bVar2 = newOpcode == StSlot_Long;
    type = INT64;
    type_00 = TyInt64;
    break;
  case LdSlot_Flt:
  case StSlot_Flt:
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    bVar2 = newOpcode == StSlot_Flt;
    type = FLOAT32;
    type_00 = TyFloat32;
    break;
  case LdArr_Func:
    RVar4 = GetRegSlotFromInt64Reg(this,instance);
    pRVar7 = BuildSrcOpnd(this,RVar4,TyInt64);
    RVar4 = GetRegSlotFromIntReg(this,slotIndex);
    pRVar8 = BuildSrcOpnd(this,RVar4,TyUint32);
    src1Opnd = IR::IndirOpnd::New(pRVar7,pRVar8,TyInt64,this->m_func);
    RVar4 = GetRegSlotFromInt64Reg(this,value);
    pRVar7 = BuildDstOpnd(this,RVar4,TyInt64);
    pFVar10 = this->m_func;
    OVar11 = LdAsmJsFunc;
    goto LAB_004b8efa;
  case LdArr_WasmFunc:
    RVar4 = GetRegSlotFromInt64Reg(this,instance);
    pRVar7 = BuildSrcOpnd(this,RVar4,TyInt64);
    RVar4 = GetRegSlotFromIntReg(this,slotIndex);
    pRVar8 = BuildSrcOpnd(this,RVar4,TyUint32);
    RVar4 = GetRegSlotFromInt64Reg(this,value);
    dstOpnd = BuildDstOpnd(this,RVar4,TyInt64);
    instr = IR::Instr::New(LdWasmFunc,&dstOpnd->super_Opnd,&pRVar7->super_Opnd,&pRVar8->super_Opnd,
                           this->m_func);
    goto LAB_004b8d80;
  default:
    switch(newOpcode) {
    case Simd128_StSlot_I8:
switchD_004b8c20_caseD_18c:
      type_00 = TySimd128I8;
      OVar3 = Simd128_StSlot_I8;
      break;
    case Simd128_LdSlot_U4:
    case Simd128_StSlot_U4:
      type_00 = TySimd128U4;
      OVar3 = Simd128_StSlot_U4;
      break;
    case Simd128_LdSlot_U8:
    case Simd128_StSlot_U8:
      type_00 = TySimd128U8;
      OVar3 = Simd128_StSlot_U8;
      break;
    case Simd128_LdSlot_U16:
    case Simd128_StSlot_U16:
      type_00 = TySimd128U16;
      OVar3 = Simd128_StSlot_U16;
      break;
    default:
      uVar9 = newOpcode - 0x259;
      if (uVar9 < 0x18) {
        if ((3U >> (uVar9 & 0x1f) & 1) == 0) {
          if ((0x6000U >> (uVar9 & 0x1f) & 1) == 0) {
            if ((0xc00000U >> (uVar9 & 0x1f) & 1) == 0) goto LAB_004b8b95;
            type_00 = TySimd128B16;
            OVar3 = Simd128_StSlot_B16;
          }
          else {
            type_00 = TySimd128B8;
            OVar3 = Simd128_StSlot_B8;
          }
        }
        else {
          type_00 = TySimd128B4;
          OVar3 = Simd128_StSlot_B4;
        }
      }
      else {
LAB_004b8b95:
        if (newOpcode - 0xed < 2) {
          type_00 = TySimd128I4;
          OVar3 = Simd128_StSlot_I4;
        }
        else if (newOpcode - 0x141 < 2) {
          type_00 = TySimd128F4;
          OVar3 = Simd128_StSlot_F4;
        }
        else {
          if (newOpcode == Simd128_LdSlot_I8) goto switchD_004b8c20_caseD_18c;
          if ((newOpcode != Simd128_LdSlot_I16) && (newOpcode != Simd128_StSlot_I16)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                               ,0x55a,"((0))","(0)");
            if (!bVar2) {
LAB_004b8f61:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
            instr = (Instr *)0x0;
            goto LAB_004b8d80;
          }
          type_00 = TySimd128I16;
          OVar3 = Simd128_StSlot_I16;
        }
      }
    }
    bVar2 = OVar3 == newOpcode;
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetSimdValueTypeFromIRType((IRBuilderAsmJs *)&this_02->field_0,type_00);
    type = SIMD;
  }
  RVar4 = GetRegSlotFromTypedReg(this,value,type);
  pSVar6 = BuildFieldOpnd(this,1,slotIndex,PropertyKindSlots,type_00,true);
  if (bVar2) {
    this_00 = (SymOpnd *)BuildSrcOpnd(this,RVar4,type_00);
    IR::Opnd::SetValueType((Opnd *)this_00,(ValueType)local_32[0].field_0);
    pFVar10 = this->m_func;
    OVar11 = StSlot;
    this_01 = pSVar6;
  }
  else {
    this_01 = (SymOpnd *)BuildDstOpnd(this,RVar4,type_00);
    IR::Opnd::SetValueType((Opnd *)this_01,(ValueType)local_32[0].field_0);
    pFVar10 = this->m_func;
    OVar11 = LdSlot;
    this_00 = pSVar6;
  }
  instr = IR::Instr::New(OVar11,&this_01->super_Opnd,&this_00->super_Opnd,pFVar10);
LAB_004b8d80:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildElementSlot(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 slotIndex, Js::RegSlot value, Js::RegSlot instance)
{
    Assert(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode));

    Assert(instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc);

    Js::RegSlot valueRegSlot;
    IR::Opnd * slotOpnd;
    IR::RegOpnd * regOpnd;
    IR::Instr * instr = nullptr;

    WAsmJs::Types type;
    IRType irType;
    ValueType valueType;
    bool isStore = false;

    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::LdSlot:
        valueRegSlot = GetRegSlotFromPtrReg(value);

        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlotArray, TyVar);

        regOpnd = BuildDstOpnd(valueRegSlot, TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LdSlotArr:
        valueRegSlot = GetRegSlotFromPtrReg(value);

        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlots, TyVar);

        regOpnd = BuildDstOpnd(valueRegSlot, TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LdArr_Func:
    {
        IR::RegOpnd * baseOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(instance), TyMachReg);
        IR::RegOpnd * indexOpnd = BuildSrcOpnd(GetRegSlotFromIntReg(slotIndex), TyUint32);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(baseOpnd, indexOpnd, TyMachReg, m_func);

        regOpnd = BuildDstOpnd(GetRegSlotFromPtrReg(value), TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdAsmJsFunc, regOpnd, indirOpnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::LdArr_WasmFunc:
    {
        IR::RegOpnd * baseOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(instance), TyMachReg);
        IR::RegOpnd * indexOpnd = BuildSrcOpnd(GetRegSlotFromIntReg(slotIndex), TyUint32);

        regOpnd = BuildDstOpnd(GetRegSlotFromPtrReg(value), TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdWasmFunc, regOpnd, baseOpnd, indexOpnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::StSlot_Int:
    case Js::OpCodeAsmJs::LdSlot_Int:
        type = WAsmJs::INT32;
        irType = TyInt32;
        valueType = ValueType::GetInt(false);
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Int;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Long:
    case Js::OpCodeAsmJs::LdSlot_Long:
        type = WAsmJs::INT64;
        irType = TyInt64;
        valueType = ValueType::GetInt(false);
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Long;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Flt:
    case Js::OpCodeAsmJs::LdSlot_Flt:
        type = WAsmJs::FLOAT32;
        irType = TyFloat32;
        valueType = ValueType::Float;
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Flt;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Db:
    case Js::OpCodeAsmJs::LdSlot_Db:
        type = WAsmJs::FLOAT64;
        irType = TyFloat64;
        valueType = ValueType::Float;
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Db;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::Simd128_StSlot_I4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I4:
        irType = TySimd128I4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B4:
        irType = TySimd128B4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B8:
        irType = TySimd128B8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B16:
        irType = TySimd128B16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B16;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_F4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_F4:
        irType = TySimd128F4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_F4;
        goto ProcessSimdSlot;
#if 0
    case Js::OpCodeAsmJs::Simd128_StSlot_D2:
    case Js::OpCodeAsmJs::Simd128_LdSlot_D2:
        irType = TySimd128D2;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_D2;
        goto ProcessSimdSlot;
#endif // 0
    case Js::OpCodeAsmJs::Simd128_StSlot_I8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I8:
        irType = TySimd128I8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_I16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I16:
        irType = TySimd128I16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I16;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U4:
        irType = TySimd128U4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U8:
        irType = TySimd128U8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U16:
        irType = TySimd128U16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U16;
        goto ProcessSimdSlot;

    default:
        Assume(UNREACHED);
        break;
ProcessSimdSlot:
        type = WAsmJs::SIMD;
        valueType = GetSimdValueTypeFromIRType(irType);
ProcessGenericSlot:
        valueRegSlot = GetRegSlotFromTypedReg(value, type);
        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlots, irType);
        if (isStore)
        {
            regOpnd = BuildSrcOpnd(valueRegSlot, irType);
            regOpnd->SetValueType(valueType);
            instr = IR::Instr::New(Js::OpCode::StSlot, slotOpnd, regOpnd, m_func);
        }
        else
        {
            regOpnd = BuildDstOpnd(valueRegSlot, irType);
            regOpnd->SetValueType(valueType);
            instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        }
        break;
    }

    AddInstr(instr, offset);
}